

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
 __thiscall
spvtools::opt::analysis::ConstantManager::CreateConstant
          (ConstantManager *this,Type *type,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *literal_words_or_ids)

{
  uint *args_1;
  bool bVar1;
  long lVar2;
  IRContext *pIVar3;
  undefined **ppuVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RCX;
  ulong uVar5;
  spvtools *this_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  components;
  Array *at;
  Struct *st;
  Matrix *mt;
  Vector *vt;
  Bool *bt;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  local_70;
  Array *local_58;
  Struct *local_50;
  IRContext *local_48;
  Vector *local_40;
  Bool *local_38;
  spvtools local_30 [8];
  
  if ((in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish ==
      (in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    local_70.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x10);
    *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
     &((IRContext *)
      local_70.
      super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
      ._M_impl.super__Vector_impl_data._M_start)->grammar_ = literal_words_or_ids;
    ((IRContext *)
    local_70.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_start)->syntax_context_ =
         (spv_context)&PTR__Constant_00b09768;
LAB_0054264b:
    this->ctx_ = (IRContext *)
                 local_70.
                 super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
              )this;
  }
  local_38 = (Bool *)(**(code **)((literal_words_or_ids->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start + 0x10))
                               (literal_words_or_ids);
  if (local_38 != (Bool *)0x0) {
    args_1 = (in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(in_RCX->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)args_1 != 4) {
      __assert_fail("literal_words_or_ids.size() == 1 && \"Bool constant should be declared with one operand\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                    ,0xf9,
                    "std::unique_ptr<Constant> spvtools::opt::analysis::ConstantManager::CreateConstant(const Type *, const std::vector<uint32_t> &) const"
                   );
    }
    MakeUnique<spvtools::opt::analysis::BoolConstant,spvtools::opt::analysis::Bool_const*&,unsigned_int_const&>
              ((spvtools *)&local_70,&local_38,args_1);
    goto LAB_0054264b;
  }
  lVar2 = (**(code **)((literal_words_or_ids->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 0x14))(literal_words_or_ids);
  if (lVar2 != 0) {
    pIVar3 = (IRContext *)operator_new(0x28);
    *(long *)&pIVar3->grammar_ = lVar2;
    pIVar3->syntax_context_ = (spv_context)&PTR__ScalarConstant_00b09968;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &(pIVar3->grammar_).operandTable_,in_RCX);
    ppuVar4 = &PTR__ScalarConstant_00b09a40;
LAB_005426d5:
    pIVar3->syntax_context_ = (spv_context)ppuVar4;
    this->ctx_ = pIVar3;
    return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
              )this;
  }
  lVar2 = (**(code **)((literal_words_or_ids->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start + 0x18))(literal_words_or_ids);
  if (lVar2 != 0) {
    pIVar3 = (IRContext *)operator_new(0x28);
    *(long *)&pIVar3->grammar_ = lVar2;
    pIVar3->syntax_context_ = (spv_context)&PTR__ScalarConstant_00b09968;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &(pIVar3->grammar_).operandTable_,in_RCX);
    ppuVar4 = &PTR__ScalarConstant_00b09b30;
    goto LAB_005426d5;
  }
  local_40 = (Vector *)
             (**(code **)((literal_words_or_ids->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 0x1c))(literal_words_or_ids);
  if (local_40 == (Vector *)0x0) {
    local_48 = (IRContext *)
               (**(code **)((literal_words_or_ids->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start + 0x20))(literal_words_or_ids);
    if (local_48 == (IRContext *)0x0) {
      local_50 = (Struct *)
                 (**(code **)((literal_words_or_ids->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start + 0x3c))
                           (literal_words_or_ids);
      if (local_50 == (Struct *)0x0) {
        local_58 = (Array *)(**(code **)((literal_words_or_ids->
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         )._M_impl.super__Vector_impl_data._M_start + 0x30))
                                      (literal_words_or_ids);
        if (local_58 == (Array *)0x0) {
          this->ctx_ = (IRContext *)0x0;
          return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
                  )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
                    )this;
        }
        GetConstantsFromIds(&local_70,(ConstantManager *)type,in_RCX);
        if (local_70.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_70.
            super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
            ._M_impl.super__Vector_impl_data._M_finish) goto LAB_005428a0;
        this_00 = local_30;
        MakeUnique<spvtools::opt::analysis::ArrayConstant,spvtools::opt::analysis::Array_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                  (this_00,&local_58,&local_70);
        goto LAB_00542898;
      }
      GetConstantsFromIds(&local_70,(ConstantManager *)type,in_RCX);
      if (local_70.
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_70.
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_00 = (spvtools *)&local_58;
        MakeUnique<spvtools::opt::analysis::StructConstant,spvtools::opt::analysis::Struct_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                  (this_00,&local_50,&local_70);
        goto LAB_00542898;
      }
LAB_005428a0:
      pIVar3 = (IRContext *)0x0;
    }
    else {
      GetConstantsFromIds(&local_70,(ConstantManager *)type,in_RCX);
      if (local_70.
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_70.
          super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) goto LAB_005428a0;
      this_00 = (spvtools *)&local_50;
      MakeUnique<spvtools::opt::analysis::MatrixConstant,spvtools::opt::analysis::Matrix_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                (this_00,(Matrix **)&local_48,&local_70);
LAB_00542898:
      pIVar3 = *(IRContext **)this_00;
    }
    this->ctx_ = pIVar3;
    if ((IRContext *)
        local_70.
        super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        ._M_impl.super__Vector_impl_data._M_start == (IRContext *)0x0) {
      return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
                )this;
    }
    uVar5 = (long)local_70.
                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
            (long)local_70.
                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    goto LAB_005428b6;
  }
  GetConstantsFromIds(&local_70,(ConstantManager *)type,in_RCX);
  pIVar3 = (IRContext *)
           local_70.
           super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((local_70.
       super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_70.
       super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (bVar1 = std::
              all_of<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const**,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__0>
                        (local_70.
                         super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_70.
                         super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish), !bVar1)) {
    this->ctx_ = (IRContext *)0x0;
LAB_0054277a:
    local_70.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar3;
    if (pIVar3 == (IRContext *)0x0) {
      return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
                )this;
    }
  }
  else {
    bVar1 = std::
            all_of<__gnu_cxx::__normal_iterator<spvtools::opt::analysis::Constant_const**,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>>,spvtools::opt::analysis::ConstantManager::CreateConstant(spvtools::opt::analysis::Type_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>const&)const::__1>
                      ((__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                        )pIVar3,(__normal_iterator<const_spvtools::opt::analysis::Constant_**,_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_>
                                 )local_70.
                                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                       (anon_class_8_1_809a237a)(*(Constant **)pIVar3)->type_);
    if (bVar1) {
      MakeUnique<spvtools::opt::analysis::VectorConstant,spvtools::opt::analysis::Vector_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
                ((spvtools *)&local_48,&local_40,&local_70);
      this->ctx_ = local_48;
      pIVar3 = (IRContext *)
               local_70.
               super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0054277a;
    }
    this->ctx_ = (IRContext *)0x0;
    local_70.
    super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pIVar3;
  }
  uVar5 = (long)local_70.
                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage -
          (long)local_70.
                super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
LAB_005428b6:
  operator_delete(local_70.
                  super__Vector_base<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,uVar5);
  return (__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Constant> ConstantManager::CreateConstant(
    const Type* type, const std::vector<uint32_t>& literal_words_or_ids) const {
  if (literal_words_or_ids.size() == 0) {
    // Constant declared with OpConstantNull
    return MakeUnique<NullConstant>(type);
  } else if (auto* bt = type->AsBool()) {
    assert(literal_words_or_ids.size() == 1 &&
           "Bool constant should be declared with one operand");
    return MakeUnique<BoolConstant>(bt, literal_words_or_ids.front());
  } else if (auto* it = type->AsInteger()) {
    return MakeUnique<IntConstant>(it, literal_words_or_ids);
  } else if (auto* ft = type->AsFloat()) {
    return MakeUnique<FloatConstant>(ft, literal_words_or_ids);
  } else if (auto* vt = type->AsVector()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    // All components of VectorConstant must be of type Bool, Integer or Float.
    if (!std::all_of(components.begin(), components.end(),
                     [](const Constant* c) {
                       if (c->type()->AsBool() || c->type()->AsInteger() ||
                           c->type()->AsFloat()) {
                         return true;
                       } else {
                         return false;
                       }
                     }))
      return nullptr;
    // All components of VectorConstant must be in the same type.
    const auto* component_type = components.front()->type();
    if (!std::all_of(components.begin(), components.end(),
                     [&component_type](const Constant* c) {
                       if (c->type() == component_type) return true;
                       return false;
                     }))
      return nullptr;
    return MakeUnique<VectorConstant>(vt, components);
  } else if (auto* mt = type->AsMatrix()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<MatrixConstant>(mt, components);
  } else if (auto* st = type->AsStruct()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<StructConstant>(st, components);
  } else if (auto* at = type->AsArray()) {
    auto components = GetConstantsFromIds(literal_words_or_ids);
    if (components.empty()) return nullptr;
    return MakeUnique<ArrayConstant>(at, components);
  } else {
    return nullptr;
  }
}